

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

Bool tidyInitSource(TidyInputSource *source,void *srcData,TidyGetByteFunc gbFunc,
                   TidyUngetByteFunc ugbFunc,TidyEOFFunc endFunc)

{
  if (endFunc != (TidyEOFFunc)0x0 &&
      ((ugbFunc != (TidyUngetByteFunc)0x0 && gbFunc != (TidyGetByteFunc)0x0) &&
      (srcData != (void *)0x0 && source != (TidyInputSource *)0x0))) {
    source->sourceData = srcData;
    source->getByte = gbFunc;
    source->ungetByte = ugbFunc;
    source->eof = endFunc;
  }
  return (Bool)(endFunc != (TidyEOFFunc)0x0 &&
               ((ugbFunc != (TidyUngetByteFunc)0x0 && gbFunc != (TidyGetByteFunc)0x0) &&
               (srcData != (void *)0x0 && source != (TidyInputSource *)0x0)));
}

Assistant:

Bool TIDY_CALL tidyInitSource( TidyInputSource*  source,
                               void*             srcData,
                               TidyGetByteFunc   gbFunc,
                               TidyUngetByteFunc ugbFunc,
                               TidyEOFFunc       endFunc )
{
  Bool status = ( source && srcData && gbFunc && ugbFunc && endFunc );

  if ( status )
  {
    source->sourceData = srcData;
    source->getByte    = gbFunc;
    source->ungetByte  = ugbFunc;
    source->eof        = endFunc;
  }

  return status;
}